

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::Number::Number(Number *this)

{
  allocator local_31;
  string local_30 [32];
  Number *local_10;
  Number *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Number",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this->num = 0;
  return;
}

Assistant:

MyCompiler::Number::Number()
        : AbstractAstNode("Number")
{}